

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<TraceEnum::EnumValue>::copyAppend
          (QGenericArrayOps<TraceEnum::EnumValue> *this,EnumValue *b,EnumValue *e)

{
  qsizetype *pqVar1;
  EnumValue *pEVar2;
  long lVar3;
  Data *pDVar4;
  int iVar5;
  
  if ((b != e) && (b < e)) {
    pEVar2 = (this->super_QArrayDataPointer<TraceEnum::EnumValue>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<TraceEnum::EnumValue>).size;
      pDVar4 = (b->name).d.d;
      pEVar2[lVar3].name.d.d = pDVar4;
      pEVar2[lVar3].name.d.ptr = (b->name).d.ptr;
      pEVar2[lVar3].name.d.size = (b->name).d.size;
      if (pDVar4 != (Data *)0x0) {
        LOCK();
        (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      iVar5 = b->range;
      pEVar2[lVar3].value = b->value;
      pEVar2[lVar3].range = iVar5;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<TraceEnum::EnumValue>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }